

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsCommon.h
# Opt level: O2

void __thiscall
Scs::Allocator<Scs::Address>::construct<Scs::Socket,std::shared_ptr<Scs::Address>&>
          (Allocator<Scs::Address> *this,Socket *ptr,shared_ptr<Scs::Address> *args)

{
  __shared_ptr<Scs::Address,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<Scs::Address,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,&args->super___shared_ptr<Scs::Address,_(__gnu_cxx::_Lock_policy)2>);
  Socket::Socket(ptr,(AddressPtr *)&local_20);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_20._M_refcount);
  return;
}

Assistant:

void construct(U* ptr, Args&&  ... args) { ::new ((void*)(ptr)) U(std::forward<Args>(args)...); }